

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

size_t Catch::listTags(Config *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestCaseFilters *pTVar2;
  TestCaseInfo *pTVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  IRegistryHub *pIVar7;
  undefined4 extraout_var;
  long *plVar8;
  iterator iVar9;
  _Rb_tree_node_base *p_Var10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  size_type *psVar13;
  long lVar14;
  TestCaseFilters *this;
  char cVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  TestCase *testCase;
  bool bVar19;
  string tagName;
  Text wrapper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  tagCounts;
  key_type local_130;
  TestCase *local_110;
  TestCase *local_108;
  Config *local_100;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  char local_e8 [8];
  char local_e0 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_a0;
  TextAttributes local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar16 = "All available tags:\n";
    lVar14 = 0x14;
  }
  else {
    pcVar16 = "Matching tags:\n";
    lVar14 = 0xf;
  }
  local_100 = config;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,lVar14);
  pIVar7 = getRegistryHub();
  iVar6 = (*pIVar7->_vptr_IRegistryHub[3])(pIVar7);
  plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x10))
                             ((long *)CONCAT44(extraout_var,iVar6));
  testCase = (TestCase *)*plVar8;
  local_108 = (TestCase *)plVar8[1];
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (testCase == local_108) {
    uVar18 = 4;
  }
  else {
    uVar18 = 0;
    do {
      this = (local_100->m_filterSets).
             super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
             _M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (local_100->m_filterSets).
               super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      while ((bVar19 = this != pTVar2, bVar19 &&
             (bVar5 = TestCaseFilters::shouldInclude(this,testCase), bVar5))) {
        this = this + 1;
      }
      if (!bVar19) {
        pTVar3 = &testCase->super_TestCaseInfo;
        local_110 = testCase;
        for (p_Var10 = (testCase->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_left;
            (_Rb_tree_header *)p_Var10 != &(pTVar3->tags)._M_t._M_impl.super__Rb_tree_header;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          if (uVar18 <= local_130._M_string_length) {
            uVar18 = local_130._M_string_length;
          }
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find(&local_a0,&local_130);
          if ((_Rb_tree_header *)iVar9._M_node == &local_a0._M_impl.super__Rb_tree_header) {
            local_f8 = (undefined1  [8])local_e8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_f8,local_130._M_dataplus._M_p,
                       local_130._M_dataplus._M_p + local_130._M_string_length);
            local_e0[8] = '\x01';
            local_e0[9] = '\0';
            local_e0[10] = '\0';
            local_e0[0xb] = '\0';
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                        *)&local_a0,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                        *)local_f8);
            testCase = local_110;
            if (local_f8 != (undefined1  [8])local_e8) {
              operator_delete((void *)local_f8);
              testCase = local_110;
            }
          }
          else {
            iVar9._M_node[2]._M_color = iVar9._M_node[2]._M_color + _S_black;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
        }
      }
      testCase = testCase + 1;
    } while (testCase != local_108);
    uVar18 = uVar18 + 4;
  }
  uVar17 = 0x46;
  if (uVar18 < 0x46) {
    uVar17 = uVar18;
  }
  if ((_Rb_tree_header *)local_a0._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_a0._M_impl.super__Rb_tree_header) {
    paVar1 = &local_130.field_2;
    local_110 = (TestCase *)(uVar17 + 2);
    p_Var12 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::operator+(&local_50,"[",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var12 + 1));
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar13 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_130.field_2._M_allocated_capacity = *psVar13;
        local_130.field_2._8_8_ = plVar8[3];
        local_130._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar13;
        local_130._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_130._M_string_length = plVar8[1];
      *plVar8 = (long)psVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      local_70.initialIndent = 0xffffffffffffffff;
      local_70.tabChar = '\t';
      local_70.indent = 2;
      local_70.width = uVar17;
      Text::Text((Text *)local_f8,&local_130,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      operator<<((ostream *)&std::cout,(Text *)local_f8);
      uVar18 = local_b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length;
      (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x17);
      cVar15 = (char)local_110 - (char)uVar18;
      if (uVar17 <= uVar18) {
        cVar15 = '\x02';
      }
      local_130._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_130,cVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_130._M_dataplus._M_p,local_130._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      (**(code **)(*Colour::impl + 0x10))(Colour::impl,0);
      poVar11 = (ostream *)std::ostream::operator<<(&std::cout,p_Var12[2]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
      if (local_f8 != (undefined1  [8])local_e8) {
        operator_delete((void *)local_f8);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != &local_a0._M_impl.super__Rb_tree_header);
  }
  sVar4 = local_a0._M_impl.super__Rb_tree_header._M_node_count;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"tag","");
  local_f8 = (undefined1  [8])sVar4;
  local_f0._M_p = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_130._M_dataplus._M_p,
             local_130._M_dataplus._M_p + local_130._M_string_length);
  poVar11 = operator<<((ostream *)&std::cout,(pluralise *)local_f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  if (local_f0._M_p != local_e0) {
    operator_delete(local_f0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  sVar4 = local_a0._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_a0);
  return (size_t)(pointer)sVar4;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }